

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O3

error_or<int> * __thiscall
pstore::http::details::
read_and_send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
          (error_or<int> *__return_storage_ptr__,details *this,anon_class_8_1_4c539acc sender,int io
          ,descriptor *fd)

{
  ssize_t size;
  error_or<int> *peVar1;
  undefined4 in_register_0000000c;
  descriptor *this_00;
  error_or<int> eo;
  array<unsigned_char,_1024UL> buffer;
  element_type *local_470;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_468;
  error_or<int> local_460;
  not_null<void_*> local_448;
  extent_type<_1L> local_440;
  undefined1 *local_438;
  undefined1 local_430 [1024];
  
  this_00 = (descriptor *)CONCAT44(in_register_0000000c,io);
  memset(local_430,0,0x400);
  local_448.ptr_ = local_430;
  pstore::gsl::not_null<void_*>::ensure_invariant(&local_448);
  size = romfs::descriptor::read(this_00,(int)local_448.ptr_,(void *)0x1,0x400);
  if (size == 0) {
    __return_storage_ptr__->has_error_ = false;
    peVar1 = (error_or<int> *)
             error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(__return_storage_ptr__);
    (peVar1->field_0).storage_ = SUB84(sender.actual,0);
  }
  else {
    pstore::gsl::details::extent_type<-1L>::extent_type(&local_440,size);
    local_438 = local_430;
    send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
              (&local_460,(http *)this,sender.actual & 0xffffffffU,(int)&local_440,
               (span<const_unsigned_char,__1L> *)fd);
    if (local_460.has_error_ == true) {
      __return_storage_ptr__->has_error_ = true;
      error_or<int>::copy_construct<int>(__return_storage_ptr__,&local_460);
    }
    else {
      local_470 = (this_00->f_).
                  super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_468 = (this_00->f_).
                  super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_468 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_468->_M_use_count = local_468->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_468->_M_use_count = local_468->_M_use_count + 1;
        }
      }
      read_and_send<(anonymous_namespace)::ServeStaticContent::serve_path(std::__cxx11::string_const&)const::__0,int>
                (__return_storage_ptr__,this,sender.actual & 0xffffffffU,(int)&local_470,fd);
      if (local_468 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468);
      }
    }
    if (local_460.has_error_ == false) {
      peVar1 = (error_or<int> *)
               error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_460);
    }
    else {
      peVar1 = (error_or<int> *)
               error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_460)
      ;
    }
  }
  return peVar1;
}

Assistant:

pstore::error_or<IO> read_and_send (Sender sender, IO io,
                                                pstore::romfs::descriptor fd) {
                std::array<std::uint8_t, 1024> buffer{{0}};
                auto * const data = buffer.data ();
                std::size_t const num_read =
                    fd.read (data, sizeof (decltype (buffer)::value_type), buffer.size ());
                if (num_read == 0) {
                    return pstore::error_or<IO>{io};
                }
                pstore::error_or<IO> const eo =
                    send (sender, io, gsl::span<std::uint8_t const> (data, data + num_read));
                if (!eo) {
                    return eo;
                }
                return read_and_send (sender, io, fd);
            }